

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O3

int find_label(disctx *ctx,section *sect,int ofs,int start_at)

{
  int *piVar1;
  int iVar2;
  
  if (sect->first_label != -1) {
    iVar2 = sect->first_label;
    if (-1 < start_at) {
      iVar2 = start_at;
    }
    if (iVar2 <= sect->last_label) {
      piVar1 = &ctx->labels[iVar2].type;
      do {
        if ((*piVar1 == 0) && (*(ull *)(piVar1 + -2) == (long)ofs)) {
          return iVar2;
        }
        iVar2 = iVar2 + 1;
        piVar1 = piVar1 + 6;
      } while (sect->last_label + 1 != iVar2);
    }
  }
  return -1;
}

Assistant:

int find_label(struct disctx *ctx, struct section *sect, int ofs, int start_at) {
	int i;
	/* Doesn't have any labels */
	if (sect->first_label == -1)
		return -1;
	for (i = start_at >= 0 ? start_at : sect->first_label; i <= sect->last_label; i++) {
		if (ctx->labels[i].type == 0 && ctx->labels[i].val == ofs)
			return i;
	}
	return -1;
}